

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_manager.cpp
# Opt level: O2

void __thiscall
duckdb::DatabaseManager::DetachDatabase
          (DatabaseManager *this,ClientContext *context,string *name,OnEntryNotFound if_not_found)

{
  __type _Var1;
  bool bVar2;
  string *__lhs;
  pointer this_00;
  BinderException *pBVar3;
  allocator local_89;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  __lhs = GetDefaultDatabase_abi_cxx11_(context);
  _Var1 = ::std::operator==(__lhs,name);
  if (_Var1) {
    pBVar3 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_88,
               "Cannot detach database \"%s\" because it is the default database. Select a different database using `USE` to allow detaching this database"
               ,&local_89);
    ::std::__cxx11::string::string((string *)&local_48,(string *)name);
    BinderException::BinderException<std::__cxx11::string>(pBVar3,&local_88,&local_48);
    __cxa_throw(pBVar3,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_00 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::
            operator->(&this->databases);
  bVar2 = CatalogSet::DropEntry(this_00,context,name,false,true);
  if ((if_not_found == THROW_EXCEPTION) && (!bVar2)) {
    pBVar3 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_88,"Failed to detach database with name \"%s\": database not found",
               &local_89);
    ::std::__cxx11::string::string((string *)&local_68,(string *)name);
    BinderException::BinderException<std::__cxx11::string>(pBVar3,&local_88,&local_68);
    __cxa_throw(pBVar3,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void DatabaseManager::DetachDatabase(ClientContext &context, const string &name, OnEntryNotFound if_not_found) {
	if (GetDefaultDatabase(context) == name) {
		throw BinderException("Cannot detach database \"%s\" because it is the default database. Select a different "
		                      "database using `USE` to allow detaching this database",
		                      name);
	}

	if (!databases->DropEntry(context, name, false, true)) {
		if (if_not_found == OnEntryNotFound::THROW_EXCEPTION) {
			throw BinderException("Failed to detach database with name \"%s\": database not found", name);
		}
	}
}